

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_io.c
# Opt level: O0

int kvtree_lseek(char *file,int fd,off_t pos,int whence)

{
  uint uVar1;
  __off_t _Var2;
  uint *puVar3;
  int *piVar4;
  char *pcVar5;
  off_t rc;
  int whence_local;
  off_t pos_local;
  int fd_local;
  char *file_local;
  
  _Var2 = lseek(fd,pos,whence);
  if (_Var2 == -1) {
    puVar3 = (uint *)__errno_location();
    uVar1 = *puVar3;
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    kvtree_err("Error seeking %s: errno=%d %s @ %s:%d",file,(ulong)uVar1,pcVar5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_io.c"
               ,0xfb);
  }
  file_local._4_4_ = (uint)(_Var2 == -1);
  return file_local._4_4_;
}

Assistant:

int kvtree_lseek(const char* file, int fd, off_t pos, int whence)
{
  off_t rc = lseek(fd, pos, whence);
  if (rc == (off_t)-1) {
    kvtree_err("Error seeking %s: errno=%d %s @ %s:%d",
      file, errno, strerror(errno), __FILE__, __LINE__
    );
    return KVTREE_FAILURE;
  }
  return KVTREE_SUCCESS;
}